

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deCommandLine.cpp
# Opt level: O3

void de::cmdline::parseType<int>(char *src,int *dst)

{
  invalid_argument *this;
  istringstream str;
  allocator<char> local_1b1;
  long *local_1b0 [2];
  long local_1a0 [2];
  long local_190 [4];
  uint auStack_170 [22];
  ios_base local_118 [264];
  
  std::__cxx11::string::string<std::allocator<char>>((string *)local_1b0,src,&local_1b1);
  std::__cxx11::istringstream::istringstream((istringstream *)local_190,(string *)local_1b0,_S_in);
  if (local_1b0[0] != local_1a0) {
    operator_delete(local_1b0[0],local_1a0[0] + 1);
  }
  std::istream::operator>>((istream *)local_190,dst);
  if ((*(uint *)((long)auStack_170 + *(long *)(local_190[0] + -0x18)) & 3) == 2) {
    std::__cxx11::istringstream::~istringstream((istringstream *)local_190);
    std::ios_base::~ios_base(local_118);
    return;
  }
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this,"invalid integer literal");
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void parseType<int> (const char* src, int* dst)
{
	std::istringstream str(src);
	str >> *dst;
	if (str.bad() || !str.eof())
		throw std::invalid_argument("invalid integer literal");
}